

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# luckyFast16.c
# Opt level: O0

int minTemp1_fast_moreThen5(word *pInOut,int iVar,int nWords,int *pDifStart)

{
  int iVar1;
  int iVar2;
  int shiftBlock;
  int wordBlock;
  int temp;
  int j;
  int i;
  int *pDifStart_local;
  int nWords_local;
  int iVar_local;
  word *pInOut_local;
  
  iVar1 = 1 << ((char)iVar - 6U & 0x1f);
  temp = (nWords - iVar1) + -1;
  do {
    if (temp < 0) {
      *pDifStart = 0;
      return 1;
    }
    for (wordBlock = 0; wordBlock < iVar1; wordBlock = wordBlock + 1) {
      iVar2 = CompareWords(pInOut[temp - wordBlock],pInOut[(temp - wordBlock) - iVar1]);
      if (iVar2 != 0) {
        if (iVar2 == -1) {
          *pDifStart = temp + iVar1 + 1;
          return 1;
        }
        *pDifStart = temp + iVar1 + 1;
        return 2;
      }
    }
    temp = temp + iVar1 * -4;
  } while( true );
}

Assistant:

int minTemp1_fast_moreThen5(word* pInOut, int iVar, int nWords, int* pDifStart)
{
    int i, j, temp;
    int  wordBlock = 1<<(iVar-6);
    int  shiftBlock = wordBlock*4;
//    printf("in minTemp1_fast_moreThen5\n");

    for(i=nWords - wordBlock - 1; i>=0; i-=shiftBlock)
        for(j=0;j<wordBlock;j++)
        {
            temp = CompareWords(pInOut[i-j],pInOut[i-j-wordBlock]);
            if(temp == 0)
                continue;
            else if(temp == -1)
            {
                *pDifStart = i+wordBlock+1;
                return 1;
            }
            else
            {
                *pDifStart = i+wordBlock+1;
                return 2;
            }
        }
    *pDifStart=0;
//    printf("out minTemp1_fast_moreThen5\n");

    return 1;
}